

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppgenerator.cpp
# Opt level: O3

void __thiscall CppGenerator::generateDecl(CppGenerator *this,QTextStream *out)

{
  Grammar *pGVar1;
  char cVar2;
  QTextStream *pQVar3;
  _List_node_base *p_Var4;
  _Base_ptr p_Var5;
  _List_node_base *p_Var6;
  char *pcVar7;
  char16_t *pcVar8;
  qsizetype qVar9;
  _Rb_tree_header *p_Var10;
  int iVar11;
  long in_FS_OFFSET;
  QStringView QVar12;
  QStringView QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QTextStream *)QTextStream::operator<<(out,"class ");
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&this->grammar->table_name);
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"{");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"public:");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    enum VariousConstants {");
  Qt::endl(pQVar3);
  p_Var5 = (this->grammar->terminals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(this->grammar->terminals)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var10) {
    do {
      p_Var4 = *(_List_node_base **)(p_Var5 + 1);
      local_58.d.d = (Data *)p_Var4[1]._M_next;
      local_58.d.ptr = (char16_t *)p_Var4[1]._M_prev;
      local_58.d.size = (qsizetype)p_Var4[2]._M_next;
      if ((QArrayData *)local_58.d.d != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_58.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_58.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        p_Var4 = *(_List_node_base **)(p_Var5 + 1);
      }
      pGVar1 = this->grammar;
      iVar11 = 0;
      for (p_Var6 = (pGVar1->names).super__List_base<QString,_std::allocator<QString>_>._M_impl.
                    _M_node.super__List_node_base._M_next; p_Var6 != p_Var4;
          p_Var6 = p_Var6->_M_next) {
        iVar11 = iVar11 + 1;
      }
      if ((_List_node_base *)local_58.d.size == (_List_node_base *)0x7) {
        QVar13.m_data = local_58.d.ptr;
        QVar13.m_size = 7;
        QVar15.m_data = "$accept";
        QVar15.m_size = 7;
        cVar2 = QtPrivate::equalStrings(QVar13,QVar15);
        if (cVar2 == '\0') goto LAB_00107b99;
        qVar9 = 0xd;
        pcVar7 = "ACCEPT_SYMBOL";
LAB_00107b92:
        QVar16.m_data = pcVar7;
        QVar16.m_size = qVar9;
        QString::operator=(&local_58,QVar16);
      }
      else {
        if ((_List_node_base *)local_58.d.size == (_List_node_base *)0x4) {
          QVar12.m_data = local_58.d.ptr;
          QVar12.m_size = 4;
          QVar14.m_data = "$end";
          QVar14.m_size = 4;
          cVar2 = QtPrivate::equalStrings(QVar12,QVar14);
          if (cVar2 != '\0') {
            qVar9 = 10;
            pcVar7 = "EOF_SYMBOL";
            goto LAB_00107b92;
          }
        }
LAB_00107b99:
        pcVar8 = (pGVar1->token_prefix).d.ptr;
        if (pcVar8 == (char16_t *)0x0) {
          pcVar8 = (char16_t *)&QString::_empty;
        }
        QString::insert((longlong)&local_58,(QChar *)0x0,(longlong)pcVar8);
      }
      pQVar3 = (QTextStream *)QTextStream::operator<<(out,"        ");
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&local_58);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3," = ");
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,iVar11);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
      Qt::endl(pQVar3);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var10);
  }
  pQVar3 = (QTextStream *)Qt::endl(out);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        ACCEPT_STATE = ");
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,this->accept_state);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        RULE_COUNT = ");
  pQVar3 = (QTextStream *)
           QTextStream::operator<<
                     (pQVar3,(this->grammar->rules).super__List_base<Rule,_std::allocator<Rule>_>.
                             _M_impl._M_node._M_size);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        STATE_COUNT = ");
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,this->state_count);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        TERMINAL_COUNT = ");
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,this->terminal_count);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        NON_TERMINAL_COUNT = ");
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,this->non_terminal_count);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        GOTO_INDEX_OFFSET = ");
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(this->compressed_action).index.d.size);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        GOTO_INFO_OFFSET = ");
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(this->compressed_action).info.d.size);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,",");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        GOTO_CHECK_OFFSET = ");
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(this->compressed_action).check.d.size);
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    };");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)
           QTextStream::operator<<(pQVar3,"    static const char *const     spell[];");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)
           QTextStream::operator<<(pQVar3,"    static const short             lhs[];");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)
           QTextStream::operator<<(pQVar3,"    static const short             rhs[];");
  Qt::endl(pQVar3);
  if (this->debug_info != false) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    debugInfoProt(&local_58,this);
    pQVar3 = (QTextStream *)Qt::endl(out);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"#ifndef ");
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&local_58);
    pQVar3 = (QTextStream *)Qt::endl(pQVar3);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    static const int     rule_index[];")
    ;
    pQVar3 = (QTextStream *)Qt::endl(pQVar3);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    static const int      rule_info[];")
    ;
    pQVar3 = (QTextStream *)Qt::endl(pQVar3);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"#endif // ");
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&local_58);
    pQVar3 = (QTextStream *)Qt::endl(pQVar3);
    Qt::endl(pQVar3);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar3 = (QTextStream *)QTextStream::operator<<(out,"    static const short    goto_default[];");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)
           QTextStream::operator<<(pQVar3,"    static const short  action_default[];");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)
           QTextStream::operator<<(pQVar3,"    static const short    action_index[];");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)
           QTextStream::operator<<(pQVar3,"    static const short     action_info[];");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)
           QTextStream::operator<<(pQVar3,"    static const short    action_check[];");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)
           QTextStream::operator<<(pQVar3,"    static inline int nt_action (int state, int nt)");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    {");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)
           QTextStream::operator<<
                     (pQVar3,
                      "        const int yyn = action_index [GOTO_INDEX_OFFSET + state] + nt;");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)
           QTextStream::operator<<
                     (pQVar3,"        if (yyn < 0 || action_check [GOTO_CHECK_OFFSET + yyn] != nt)")
  ;
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"            return goto_default [nt];");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)
           QTextStream::operator<<(pQVar3,"        return action_info [GOTO_INFO_OFFSET + yyn];");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    }");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)
           QTextStream::operator<<(pQVar3,"    static inline int t_action (int state, int token)");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    {");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)
           QTextStream::operator<<(pQVar3,"        const int yyn = action_index [state] + token;");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)
           QTextStream::operator<<(pQVar3,"        if (yyn < 0 || action_check [yyn] != token)");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)
           QTextStream::operator<<(pQVar3,"            return - action_default [state];");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"        return action_info [yyn];");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    }");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"};");
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  Qt::endl(pQVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CppGenerator::generateDecl (QTextStream &out)
{
  out << "class " << grammar.table_name << Qt::endl
      << "{" << Qt::endl
      << "public:" << Qt::endl
      << "    enum VariousConstants {" << Qt::endl;

  for (const Name &t : std::as_const(grammar.terminals))
    {
      QString name = *t;
      int value = std::distance (grammar.names.begin (), t);

      if (name == "$end"_L1)
        name = "EOF_SYMBOL"_L1;

      else if (name == "$accept"_L1)
        name = "ACCEPT_SYMBOL"_L1;

      else
        name.prepend (grammar.token_prefix);

      out << "        " << name << " = " << value << "," << Qt::endl;
    }

  out << Qt::endl
      << "        ACCEPT_STATE = " << accept_state << "," << Qt::endl
      << "        RULE_COUNT = " << grammar.rules.size () << "," << Qt::endl
      << "        STATE_COUNT = " << state_count << "," << Qt::endl
      << "        TERMINAL_COUNT = " << terminal_count << "," << Qt::endl
      << "        NON_TERMINAL_COUNT = " << non_terminal_count << "," << Qt::endl
      << Qt::endl
      << "        GOTO_INDEX_OFFSET = " << compressed_action.index.size () << "," << Qt::endl
      << "        GOTO_INFO_OFFSET = " << compressed_action.info.size () << "," << Qt::endl
      << "        GOTO_CHECK_OFFSET = " << compressed_action.check.size () << Qt::endl
      << "    };" << Qt::endl
      << Qt::endl
      << "    static const char *const     spell[];" << Qt::endl
      << "    static const short             lhs[];" << Qt::endl
      << "    static const short             rhs[];" << Qt::endl;

  if (debug_info)
    {
      QString prot = debugInfoProt();

      out << Qt::endl << "#ifndef " << prot << Qt::endl
          << "    static const int     rule_index[];" << Qt::endl
          << "    static const int      rule_info[];" << Qt::endl
          << "#endif // " << prot << Qt::endl << Qt::endl;
    }

  out << "    static const short    goto_default[];" << Qt::endl
      << "    static const short  action_default[];" << Qt::endl
      << "    static const short    action_index[];" << Qt::endl
      << "    static const short     action_info[];" << Qt::endl
      << "    static const short    action_check[];" << Qt::endl
      << Qt::endl
      << "    static inline int nt_action (int state, int nt)" << Qt::endl
      << "    {" << Qt::endl
      << "        const int yyn = action_index [GOTO_INDEX_OFFSET + state] + nt;" << Qt::endl
      << "        if (yyn < 0 || action_check [GOTO_CHECK_OFFSET + yyn] != nt)" << Qt::endl
      << "            return goto_default [nt];" << Qt::endl
      << Qt::endl
      << "        return action_info [GOTO_INFO_OFFSET + yyn];" << Qt::endl
      << "    }" << Qt::endl
      << Qt::endl
      << "    static inline int t_action (int state, int token)" << Qt::endl
      << "    {" << Qt::endl
      << "        const int yyn = action_index [state] + token;" << Qt::endl
      << Qt::endl
      << "        if (yyn < 0 || action_check [yyn] != token)" << Qt::endl
      << "            return - action_default [state];" << Qt::endl
      << Qt::endl
      << "        return action_info [yyn];" << Qt::endl
      << "    }" << Qt::endl
      << "};" << Qt::endl
      << Qt::endl
      << Qt::endl;
}